

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int membr_fill(memory_bit_reader *br,int bits)

{
  size_t sVar1;
  bool bVar2;
  int bits_local;
  memory_bit_reader *br_local;
  
  while( true ) {
    bVar2 = false;
    if (br->available < bits) {
      bVar2 = br->offset < br->length;
    }
    if (!bVar2) break;
    sVar1 = br->offset;
    br->offset = sVar1 + 1;
    br->bits = br->bits << 8 | (ulong)br->bytes[sVar1];
    br->available = br->available + 8;
  }
  bVar2 = bits <= br->available;
  if (!bVar2) {
    br->at_eof = 1;
  }
  br_local._4_4_ = (uint)bVar2;
  return br_local._4_4_;
}

Assistant:

static int
membr_fill(struct memory_bit_reader *br, int bits)
{
  while (br->available < bits && br->offset < br->length)
  {
    br->bits = (br->bits << 8) | br->bytes[br->offset++];
    br->available += 8;
  }
  if (bits > br->available)
  {
    br->at_eof = 1;
    return 0;
  }
  return 1;
}